

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

void __thiscall anon_unknown.dwarf_51301::RegexExpr<char>::~RegexExpr(RegexExpr<char> *this)

{
  (this->super_Expr)._vptr_Expr = (_func_int **)&PTR__RegexExpr_00158310;
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&this->r);
  operator_delete(this,0x28);
  return;
}

Assistant:

bool parse(Context &con) const
	{
		size_t length;
		if (regexMatch(con.position.it, con.finish, r, length))
		{
			con.consume(length);
			return true;
		}
		con.set_error_pos();
		return false;
	}